

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.h
# Opt level: O0

RegisterLiveness * __thiscall
spvtools::opt::LivenessAnalysis::Get(LivenessAnalysis *this,Function *f)

{
  bool bVar1;
  pointer ppVar2;
  RegisterLiveness *__args_1;
  RegisterLiveness local_80;
  _Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false,_false>
  local_40 [2];
  _Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false>
  local_28;
  iterator it;
  Function *f_local;
  LivenessAnalysis *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false>
             )(_Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false>
               )f;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_spvtools::opt::Function_*,_spvtools::opt::RegisterLiveness,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>_>_>
       ::find(&this->analysis_cache_,(key_type *)&it);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<const_spvtools::opt::Function_*,_spvtools::opt::RegisterLiveness,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>_>_>
       ::end(&this->analysis_cache_);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false,_false>
                           *)&local_28);
  }
  else {
    __args_1 = (RegisterLiveness *)&this->analysis_cache_;
    RegisterLiveness::RegisterLiveness
              (&local_80,this->context_,
               (Function *)
               it.
               super__Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false>
               ._M_cur);
    local_40[0].
    super__Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false>
               )std::
                unordered_map<spvtools::opt::Function_const*,spvtools::opt::RegisterLiveness,std::hash<spvtools::opt::Function_const*>,std::equal_to<spvtools::opt::Function_const*>,std::allocator<std::pair<spvtools::opt::Function_const*const,spvtools::opt::RegisterLiveness>>>
                ::emplace<spvtools::opt::Function*&,spvtools::opt::RegisterLiveness>
                          ((pair<std::__detail::_Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false,_false>,_bool>
                            *)&this->analysis_cache_,&it,(Function **)&local_80,__args_1);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false,_false>
             ::operator->(local_40);
    RegisterLiveness::~RegisterLiveness(&local_80);
  }
  this_local = (LivenessAnalysis *)&ppVar2->second;
  return (RegisterLiveness *)this_local;
}

Assistant:

const RegisterLiveness* Get(Function* f) {
    LivenessAnalysisMap::iterator it = analysis_cache_.find(f);
    if (it != analysis_cache_.end()) {
      return &it->second;
    }
    return &analysis_cache_.emplace(f, RegisterLiveness{context_, f})
                .first->second;
  }